

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdAddCombinePubkey(void *handle,void *combine_handle,char *pubkey)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  Pubkey key;
  CfdCapiCombinePubkey *buffer;
  string *in_stack_fffffffffffffe60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  undefined8 in_stack_fffffffffffffe68;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe70;
  allocator *paVar3;
  string local_140;
  allocator local_119;
  string local_118;
  Pubkey local_f8;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  char *local_b8;
  int local_b0;
  string *in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [32];
  CfdSourceLocation local_70;
  allocator local_51;
  string local_50 [48];
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"CombinePubkey",&local_51);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_70.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_70.filename = local_70.filename + 1;
    local_70.line = 0x543;
    local_70.funcname = "CfdAddCombinePubkey";
    cfd::core::logger::warn<>(&local_70,"pubkey is null or empty.");
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Failed to parameter. pubkey is null or empty.",&local_91)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe70,error_code,in_stack_fffffffffffffe60);
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_18 + 0x10) == 0) {
    local_b8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                       ,0x2f);
    local_b8 = local_b8 + 1;
    local_b0 = 0x54c;
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_b8,"pubkey_list is null.");
    local_da = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Failed to parameter. pubkey_list is null.",&local_d9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe70,error_code,in_stack_fffffffffffffe60);
    local_da = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar3 = &local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,local_20,paVar3);
  cfd::core::Pubkey::Pubkey(&local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  this = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           **)(local_18 + 0x10);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_140,&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  local_4 = 0;
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x5d8bde);
  return local_4;
}

Assistant:

int CfdAddCombinePubkey(
    void* handle, void* combine_handle, const char* pubkey) {
  try {
    cfd::Initialize();
    CheckBuffer(combine_handle, kPrefixCombinePubkey);
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    CfdCapiCombinePubkey* buffer =
        static_cast<CfdCapiCombinePubkey*>(combine_handle);
    if (buffer->pubkey_list == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey_list is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. pubkey_list is null.");
    }
    Pubkey key(pubkey);
    buffer->pubkey_list->push_back(key.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}